

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QSimplexVariable_*>::reserve(QList<QSimplexVariable_*> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  QArrayDataPointer<QSimplexVariable_*> *pQVar3;
  qsizetype qVar4;
  QSimplexVariable **b;
  Data *pDVar5;
  long in_RSI;
  QArrayDataPointer<QSimplexVariable_*> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QSimplexVariable_*> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QSimplexVariable_*> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QSimplexVariable_*> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QPodArrayOps<QSimplexVariable_*> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QSimplexVariable_*> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QArrayDataPointer<QSimplexVariable_*> *)capacity((QList<QSimplexVariable_*> *)0xa5eeef);
  qVar4 = QArrayDataPointer<QSimplexVariable_*>::freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)pQVar3 - qVar4) {
    QArrayDataPointer<QSimplexVariable_*>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QSimplexVariable_*>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_00a5f092;
    QArrayDataPointer<QSimplexVariable_*>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QSimplexVariable_*>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QSimplexVariable_*>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QSimplexVariable_*>::setFlag
                ((QArrayDataPointer<QSimplexVariable_*> *)0xa5ef96,(ArrayOptions)f.i);
      goto LAB_00a5f092;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QSimplexVariable **)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QSimplexVariable_*> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QSimplexVariable_*>::QArrayDataPointer
            (pQVar3,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  pQVar3 = (QArrayDataPointer<QSimplexVariable_*> *)
           QArrayDataPointer<QSimplexVariable_*>::operator->(&local_38);
  QArrayDataPointer<QSimplexVariable_*>::operator->(in_RDI);
  b = QArrayDataPointer<QSimplexVariable_*>::begin
                ((QArrayDataPointer<QSimplexVariable_*> *)0xa5f016);
  QArrayDataPointer<QSimplexVariable_*>::operator->(in_RDI);
  QArrayDataPointer<QSimplexVariable_*>::end(pQVar3);
  QtPrivate::QPodArrayOps<QSimplexVariable_*>::copyAppend
            (in_stack_ffffffffffffff90,b,(QSimplexVariable **)pQVar3);
  pDVar5 = QArrayDataPointer<QSimplexVariable_*>::d_ptr(&local_38);
  if (pDVar5 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QSimplexVariable_*> *)
         QArrayDataPointer<QSimplexVariable_*>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)pQVar3,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QSimplexVariable_*>::setFlag
              ((QArrayDataPointer<QSimplexVariable_*> *)0xa5f079,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QSimplexVariable_*>::swap(pQVar3,in_stack_ffffffffffffff78);
  QArrayDataPointer<QSimplexVariable_*>::~QArrayDataPointer(pQVar3);
LAB_00a5f092:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}